

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.c
# Opt level: O0

Socket * new_connection(SockAddr *addr,char *hostname,int port,_Bool privport,_Bool oobinline,
                       _Bool nodelay,_Bool keepalive,Plug *plug,Conf *conf,Interactor *itr)

{
  undefined8 uVar1;
  _Bool _Var2;
  uint uVar3;
  int iVar4;
  Conf *pCVar5;
  LogPolicy *pLVar6;
  Seat *pSVar7;
  ProxyNegotiator *pPVar8;
  char *pcVar9;
  SockAddr *pSVar10;
  _STACK *p_Var11;
  char *local_1a0;
  char *logmsg_2;
  char addrbuf [256];
  char *logmsg_1;
  char *logmsg;
  ProxyNegotiatorVT *vt;
  Socket *sret;
  char *proxy_canonical_name;
  SockAddr *proxy_addr;
  ProxySocket *ps;
  byte local_30;
  byte local_2f;
  byte local_2e;
  byte local_2d;
  int type;
  _Bool keepalive_local;
  _Bool nodelay_local;
  _Bool oobinline_local;
  _Bool privport_local;
  int port_local;
  char *hostname_local;
  SockAddr *addr_local;
  
  local_30 = keepalive;
  local_2f = nodelay;
  local_2e = oobinline;
  local_2d = privport;
  type = port;
  _keepalive_local = hostname;
  hostname_local = (char *)addr;
  ps._4_4_ = conf_get_int(conf,0xd);
  if ((ps._4_4_ == 0) ||
     (_Var2 = proxy_for_destination((SockAddr *)hostname_local,_keepalive_local,type,conf), !_Var2))
  {
    addr_local = (SockAddr *)sk_new((cmp *)hostname_local);
  }
  else if (((((ps._4_4_ != 6) && (ps._4_4_ != 7)) && (ps._4_4_ != 8)) ||
           (addr_local = (SockAddr *)
                         sshproxy_new_connection
                                   ((SockAddr *)hostname_local,_keepalive_local,type,
                                    (_Bool)(local_2d & 1),(_Bool)(local_2e & 1),
                                    (_Bool)(local_2f & 1),(_Bool)(local_30 & 1),plug,conf,itr),
           addr_local == (SockAddr *)0x0)) &&
          (addr_local = (SockAddr *)
                        platform_new_connection
                                  ((SockAddr *)hostname_local,_keepalive_local,type,
                                   (_Bool)(local_2d & 1),(_Bool)(local_2e & 1),(_Bool)(local_2f & 1)
                                   ,(_Bool)(local_30 & 1),plug,conf,itr),
          addr_local == (SockAddr *)0x0)) {
    proxy_addr = (SockAddr *)safemalloc(1,0x130,0);
    *(SocketVtable **)(proxy_addr->hostname + 0xe8) = &ProxySocket_sockvt;
    *(PlugVtable **)(proxy_addr->hostname + 0xf0) = &ProxySocket_plugvt;
    *(InteractorVtable **)(proxy_addr->hostname + 0xf8) = &ProxySocket_interactorvt;
    pCVar5 = conf_copy(conf);
    *(Conf **)(proxy_addr->hostname + 200) = pCVar5;
    *(Plug **)&proxy_addr->superfamily = plug;
    proxy_addr->ais = (addrinfo *)hostname_local;
    *(int *)proxy_addr->hostname = type;
    *(undefined8 *)proxy_addr = 0;
    proxy_addr->hostname[0x90] = '\0';
    proxy_addr->hostname[0x91] = '\0';
    bufchain_init((bufchain *)(proxy_addr->hostname + 0x68));
    bufchain_init((bufchain *)(proxy_addr->hostname + 0x18));
    bufchain_init((bufchain *)(proxy_addr->hostname + 0x40));
    bufchain_init((bufchain *)(proxy_addr->hostname + 0xa0));
    proxy_addr->error = (char *)0x0;
    if (itr != (Interactor *)0x0) {
      *(Interactor **)(proxy_addr->hostname + 0xd0) = itr;
      interactor_set_child
                (*(Interactor **)(proxy_addr->hostname + 0xd0),
                 (Interactor *)(proxy_addr->hostname + 0xf8));
      pLVar6 = interactor_logpolicy(*(Interactor **)(proxy_addr->hostname + 0xd0));
      *(LogPolicy **)(proxy_addr->hostname + 0xd8) = pLVar6;
      pSVar7 = interactor_borrow_seat(*(Interactor **)(proxy_addr->hostname + 0xd0));
      *(Seat **)(proxy_addr->hostname + 0xe0) = pSVar7;
    }
    switch(ps._4_4_) {
    case 1:
      logmsg = (char *)&socks4_proxy_negotiator_vt;
      break;
    case 2:
      logmsg = "p?\x12";
      break;
    case 3:
      logmsg = (char *)&http_proxy_negotiator_vt;
      break;
    case 4:
      logmsg = (char *)&telnet_proxy_negotiator_vt;
      break;
    default:
      *(char **)proxy_addr = "Proxy error: Unknown proxy method";
      return (Socket *)(proxy_addr->hostname + 0xe8);
    }
    pPVar8 = proxy_negotiator_new((ProxyNegotiatorVT *)logmsg);
    *(ProxyNegotiator **)(proxy_addr->hostname + 0x98) = pPVar8;
    *(SockAddr **)(*(long *)(proxy_addr->hostname + 0x98) + 8) = proxy_addr;
    *(undefined1 *)(*(long *)(proxy_addr->hostname + 0x98) + 0x40) = 0;
    *(undefined8 *)(*(long *)(proxy_addr->hostname + 0x98) + 0x48) = 0;
    *(undefined1 *)(*(long *)(proxy_addr->hostname + 0x98) + 0x50) = 0;
    *(char **)(*(long *)(proxy_addr->hostname + 0x98) + 0x10) = proxy_addr->hostname + 0x68;
    if (*(long *)(proxy_addr->hostname + 0xe0) == 0) {
      local_1a0 = (char *)0x0;
    }
    else {
      local_1a0 = proxy_addr->hostname + 0xf8;
    }
    *(char **)(*(long *)(proxy_addr->hostname + 0x98) + 0x38) = local_1a0;
    bufchain_sink_init((bufchain_sink *)(*(long *)(proxy_addr->hostname + 0x98) + 0x18),
                       (bufchain *)(proxy_addr->hostname + 0xa0));
    uVar1 = *(undefined8 *)(logmsg + 0x18);
    pcVar9 = conf_get_str(conf,0xe);
    uVar3 = conf_get_int(conf,0xf);
    pcVar9 = dupprintf("Will use %s proxy at %s:%d to connect to %s:%d",uVar1,pcVar9,(ulong)uVar3,
                       _keepalive_local);
    plug_log(plug,3,(SockAddr *)0x0,0,pcVar9,0);
    safefree(pcVar9);
    pcVar9 = conf_get_str(conf,0xe);
    iVar4 = conf_get_int(conf,3);
    pcVar9 = dns_log_msg(pcVar9,iVar4,"proxy");
    plug_log(plug,3,(SockAddr *)0x0,0,pcVar9,0);
    safefree(pcVar9);
    pcVar9 = conf_get_str(conf,0xe);
    iVar4 = conf_get_int(conf,3);
    proxy_canonical_name = (char *)sk_namelookup(pcVar9,(char **)&sret,iVar4);
    pcVar9 = sk_addr_error((SockAddr *)proxy_canonical_name);
    if (pcVar9 == (char *)0x0) {
      safefree(sret);
      sk_getaddr((SockAddr *)proxy_canonical_name,(char *)&logmsg_2,0x100);
      uVar1 = *(undefined8 *)(logmsg + 0x18);
      uVar3 = conf_get_int(conf,0xf);
      pcVar9 = dupprintf("Connecting to %s proxy at %s port %d",uVar1,&logmsg_2,(ulong)uVar3);
      plug_log(plug,3,(SockAddr *)0x0,0,pcVar9,0);
      safefree(pcVar9);
      pSVar10 = sk_addr_dup((SockAddr *)proxy_canonical_name);
      *(SockAddr **)(proxy_addr->hostname + 8) = pSVar10;
      iVar4 = conf_get_int(conf,0xf);
      *(int *)(proxy_addr->hostname + 0x10) = iVar4;
      proxy_addr->hostname[0x14] = local_2d & 1;
      proxy_addr->hostname[0x15] = local_2e & 1;
      proxy_addr->hostname[0x16] = local_2f & 1;
      proxy_addr->hostname[0x17] = local_30 & 1;
      p_Var11 = sk_new((cmp *)proxy_canonical_name);
      proxy_addr->error = (char *)p_Var11;
      pcVar9 = sk_socket_error((Socket *)proxy_addr->error);
      if (pcVar9 == (char *)0x0) {
        sk_set_frozen((Socket *)proxy_addr->error,false);
        proxy_negotiate((ProxySocket *)proxy_addr);
        addr_local = (SockAddr *)(proxy_addr->hostname + 0xe8);
      }
      else {
        addr_local = (SockAddr *)(proxy_addr->hostname + 0xe8);
      }
    }
    else {
      *(char **)proxy_addr = "Proxy error: Unable to resolve proxy host name";
      sk_addr_free((SockAddr *)proxy_canonical_name);
      addr_local = (SockAddr *)(proxy_addr->hostname + 0xe8);
    }
  }
  return (Socket *)addr_local;
}

Assistant:

Socket *new_connection(SockAddr *addr, const char *hostname,
                       int port, bool privport,
                       bool oobinline, bool nodelay, bool keepalive,
                       Plug *plug, Conf *conf, Interactor *itr)
{
    int type = conf_get_int(conf, CONF_proxy_type);

    if (type != PROXY_NONE &&
        proxy_for_destination(addr, hostname, port, conf))
    {
        ProxySocket *ps;
        SockAddr *proxy_addr;
        char *proxy_canonical_name;
        Socket *sret;

        if ((type == PROXY_SSH_TCPIP ||
             type == PROXY_SSH_EXEC ||
             type == PROXY_SSH_SUBSYSTEM) &&
            (sret = sshproxy_new_connection(addr, hostname, port, privport,
                                            oobinline, nodelay, keepalive,
                                            plug, conf, itr)) != NULL)
            return sret;

        if ((sret = platform_new_connection(addr, hostname, port, privport,
                                            oobinline, nodelay, keepalive,
                                            plug, conf, itr)) != NULL)
            return sret;

        ps = snew(ProxySocket);
        ps->sock.vt = &ProxySocket_sockvt;
        ps->plugimpl.vt = &ProxySocket_plugvt;
        ps->interactor.vt = &ProxySocket_interactorvt;
        ps->conf = conf_copy(conf);
        ps->plug = plug;
        ps->remote_addr = addr;       /* will need to be freed on close */
        ps->remote_port = port;

        ps->error = NULL;
        ps->pending_eof = false;
        ps->freeze = false;

        bufchain_init(&ps->pending_input_data);
        bufchain_init(&ps->pending_output_data);
        bufchain_init(&ps->pending_oob_output_data);
        bufchain_init(&ps->output_from_negotiator);

        ps->sub_socket = NULL;

        /*
         * If we've been given an Interactor by the caller, set ourselves
         * up to work with it.
         */
        if (itr) {
            ps->clientitr = itr;
            interactor_set_child(ps->clientitr, &ps->interactor);
            ps->clientlp = interactor_logpolicy(ps->clientitr);
            ps->clientseat = interactor_borrow_seat(ps->clientitr);
        }

        const ProxyNegotiatorVT *vt;
        switch (type) {
          case PROXY_HTTP:
            vt = &http_proxy_negotiator_vt;
            break;
          case PROXY_SOCKS4:
            vt = &socks4_proxy_negotiator_vt;
            break;
          case PROXY_SOCKS5:
            vt = &socks5_proxy_negotiator_vt;
            break;
          case PROXY_TELNET:
            vt = &telnet_proxy_negotiator_vt;
            break;
          default:
            ps->error = "Proxy error: Unknown proxy method";
            return &ps->sock;
        }
        ps->pn = proxy_negotiator_new(vt);
        ps->pn->ps = ps;
        ps->pn->done = false;
        ps->pn->error = NULL;
        ps->pn->aborted = false;
        ps->pn->input = &ps->pending_input_data;
        /* Provide an Interactor to the negotiator if and only if we
         * are usefully able to ask interactive questions of the user */
        ps->pn->itr = ps->clientseat ? &ps->interactor : NULL;
        bufchain_sink_init(ps->pn->output, &ps->output_from_negotiator);

        {
            char *logmsg = dupprintf("Will use %s proxy at %s:%d to connect"
                                      " to %s:%d", vt->type,
                                      conf_get_str(conf, CONF_proxy_host),
                                      conf_get_int(conf, CONF_proxy_port),
                                      hostname, port);
            plug_log(plug, PLUGLOG_PROXY_MSG, NULL, 0, logmsg, 0);
            sfree(logmsg);
        }

        {
            char *logmsg = dns_log_msg(conf_get_str(conf, CONF_proxy_host),
                                       conf_get_int(conf, CONF_addressfamily),
                                       "proxy");
            plug_log(plug, PLUGLOG_PROXY_MSG, NULL, 0, logmsg, 0);
            sfree(logmsg);
        }

        /* look-up proxy */
        proxy_addr = sk_namelookup(conf_get_str(conf, CONF_proxy_host),
                                   &proxy_canonical_name,
                                   conf_get_int(conf, CONF_addressfamily));
        if (sk_addr_error(proxy_addr) != NULL) {
            ps->error = "Proxy error: Unable to resolve proxy host name";
            sk_addr_free(proxy_addr);
            return &ps->sock;
        }
        sfree(proxy_canonical_name);

        {
            char addrbuf[256], *logmsg;
            sk_getaddr(proxy_addr, addrbuf, lenof(addrbuf));
            logmsg = dupprintf("Connecting to %s proxy at %s port %d",
                               vt->type, addrbuf,
                               conf_get_int(conf, CONF_proxy_port));
            plug_log(plug, PLUGLOG_PROXY_MSG, NULL, 0, logmsg, 0);
            sfree(logmsg);
        }

        /* create the actual socket we will be using,
         * connected to our proxy server and port.
         */
        ps->proxy_addr = sk_addr_dup(proxy_addr);
        ps->proxy_port = conf_get_int(conf, CONF_proxy_port);
        ps->proxy_privport = privport;
        ps->proxy_oobinline = oobinline;
        ps->proxy_nodelay = nodelay;
        ps->proxy_keepalive = keepalive;
        ps->sub_socket = sk_new(proxy_addr, ps->proxy_port,
                                ps->proxy_privport, ps->proxy_oobinline,
                                ps->proxy_nodelay, ps->proxy_keepalive,
                                &ps->plugimpl);
        if (sk_socket_error(ps->sub_socket) != NULL)
            return &ps->sock;

        /* start the proxy negotiation process... */
        sk_set_frozen(ps->sub_socket, false);
        proxy_negotiate(ps);

        return &ps->sock;
    }

    /* no proxy, so just return the direct socket */
    return sk_new(addr, port, privport, oobinline, nodelay, keepalive, plug);
}